

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void convert_4u32s_C1R(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  OPJ_INT32 OVar1;
  OPJ_UINT8 val_1;
  ulong uStack_28;
  OPJ_UINT32 val;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_INT32 *pDst_local;
  OPJ_BYTE *pSrc_local;
  
  pDst_local = (OPJ_INT32 *)pSrc;
  for (uStack_28 = 0; uStack_28 < (length & 0xfffffffffffffffe); uStack_28 = uStack_28 + 2) {
    OVar1 = *pDst_local;
    pDst[uStack_28] = (uint)(byte)((byte)OVar1 >> 4);
    pDst[uStack_28 + 1] = (byte)OVar1 & 0xf;
    pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
  }
  if ((length & 1) != 0) {
    pDst[uStack_28] = (int)(uint)(byte)*pDst_local >> 4;
  }
  return;
}

Assistant:

static void convert_4u32s_C1R(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                              OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)1U); i += 2U) {
        OPJ_UINT32 val = *pSrc++;
        pDst[i + 0] = (OPJ_INT32)(val >> 4);
        pDst[i + 1] = (OPJ_INT32)(val & 0xFU);
    }
    if (length & 1U) {
        OPJ_UINT8 val = *pSrc++;
        pDst[i + 0] = (OPJ_INT32)(val >> 4);
    }
}